

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void filter_src_pixels_vertical_avx2
               (__m256i *horz_out,__m256i *src,__m256i *coeffs,__m256i *res_lo,__m256i *res_hi,
               int row)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  long in_RDI;
  undefined1 (*in_R8) [32];
  int in_R9D;
  __m256i res_odd;
  __m256i res_7;
  __m256i res_5;
  __m256i res_3;
  __m256i res_1;
  __m256i res_even;
  __m256i res_6;
  __m256i res_4;
  __m256i res_2;
  __m256i res_0;
  __m256i src_7;
  __m256i src_6;
  
  pauVar1 = (undefined1 (*) [32])((long)in_R9D * 0x20 + 0x60 + in_RDI);
  auVar7 = *pauVar1;
  auVar6 = vperm2i128_avx2(*(undefined1 (*) [32])((long)in_R9D * 0x20 + 0x60 + in_RDI),
                           *(undefined1 (*) [32])((long)in_R9D * 0x20 + 0x80 + in_RDI),0x21);
  auVar5 = vpunpcklwd_avx2(*pauVar1,auVar6);
  in_RSI[6] = auVar5;
  auVar5 = vpmaddwd_avx2(*in_RSI,*in_RDX);
  auVar2 = vpmaddwd_avx2(in_RSI[2],in_RDX[1]);
  auVar3 = vpmaddwd_avx2(in_RSI[4],in_RDX[2]);
  auVar4 = vpmaddwd_avx2(in_RSI[6],in_RDX[3]);
  auVar5 = vpaddd_avx2(auVar5,auVar2);
  auVar2 = vpaddd_avx2(auVar3,auVar4);
  auVar5 = vpaddd_avx2(auVar5,auVar2);
  auVar2 = vpunpckhwd_avx2(auVar7,auVar6);
  in_RSI[7] = auVar2;
  auVar2 = vpmaddwd_avx2(in_RSI[1],in_RDX[4]);
  auVar3 = vpmaddwd_avx2(in_RSI[3],in_RDX[5]);
  auVar4 = vpmaddwd_avx2(in_RSI[5],in_RDX[6]);
  auVar6 = vpmaddwd_avx2(in_RSI[7],in_RDX[7]);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpaddd_avx2(auVar4,auVar6);
  auVar2 = vpaddd_avx2(auVar2,auVar3);
  auVar3 = vpunpckldq_avx2(auVar5,auVar2);
  *in_RCX = auVar3;
  auVar5 = vpunpckhdq_avx2(auVar5,auVar2);
  *in_R8 = auVar5;
  return;
}

Assistant:

static inline void filter_src_pixels_vertical_avx2(__m256i *horz_out,
                                                   __m256i *src,
                                                   __m256i *coeffs,
                                                   __m256i *res_lo,
                                                   __m256i *res_hi, int row) {
  const __m256i src_6 = horz_out[row + 3];
  const __m256i src_7 =
      _mm256_permute2x128_si256(horz_out[row + 3], horz_out[row + 4], 0x21);

  src[6] = _mm256_unpacklo_epi16(src_6, src_7);

  const __m256i res_0 = _mm256_madd_epi16(src[0], coeffs[0]);
  const __m256i res_2 = _mm256_madd_epi16(src[2], coeffs[1]);
  const __m256i res_4 = _mm256_madd_epi16(src[4], coeffs[2]);
  const __m256i res_6 = _mm256_madd_epi16(src[6], coeffs[3]);

  const __m256i res_even = _mm256_add_epi32(_mm256_add_epi32(res_0, res_2),
                                            _mm256_add_epi32(res_4, res_6));

  src[7] = _mm256_unpackhi_epi16(src_6, src_7);

  const __m256i res_1 = _mm256_madd_epi16(src[1], coeffs[4]);
  const __m256i res_3 = _mm256_madd_epi16(src[3], coeffs[5]);
  const __m256i res_5 = _mm256_madd_epi16(src[5], coeffs[6]);
  const __m256i res_7 = _mm256_madd_epi16(src[7], coeffs[7]);

  const __m256i res_odd = _mm256_add_epi32(_mm256_add_epi32(res_1, res_3),
                                           _mm256_add_epi32(res_5, res_7));

  // Rearrange pixels back into the order 0 ... 7
  *res_lo = _mm256_unpacklo_epi32(res_even, res_odd);
  *res_hi = _mm256_unpackhi_epi32(res_even, res_odd);
}